

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkService
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  long lVar1;
  ServiceOptions *pSVar2;
  LogMessage *other;
  long lVar3;
  long lVar4;
  LogFinisher local_79;
  ServiceDescriptor *local_78;
  DescriptorBuilder *local_70;
  LogMessage local_68;
  
  local_70 = this;
  if (*(long *)(service + 0x18) == 0) {
    pSVar2 = ServiceOptions::default_instance();
    *(ServiceOptions **)(service + 0x18) = pSVar2;
  }
  if (0 < *(int *)(service + 0x20)) {
    lVar3 = 0;
    lVar4 = 0;
    local_78 = service;
    do {
      lVar1 = *(long *)(service + 0x28);
      if ((proto->method_).super_RepeatedPtrFieldBase.current_size_ <= lVar4) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_79,other);
        internal::LogMessage::~LogMessage(&local_68);
        service = local_78;
      }
      CrossLinkMethod(local_70,(MethodDescriptor *)(lVar1 + lVar3),
                      (MethodDescriptorProto *)
                      (proto->method_).super_RepeatedPtrFieldBase.elements_[lVar4]);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x30;
    } while (lVar4 < *(int *)(service + 0x20));
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkService(
    ServiceDescriptor* service, const ServiceDescriptorProto& proto) {
  if (service->options_ == NULL) {
    service->options_ = &ServiceOptions::default_instance();
  }

  for (int i = 0; i < service->method_count(); i++) {
    CrossLinkMethod(&service->methods_[i], proto.method(i));
  }
}